

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render.cpp
# Opt level: O0

void __thiscall nivalis::Plotter::plot_explicit(Plotter *this,size_t funcid,bool reverse_xy)

{
  pointer pUVar1;
  initializer_list<nivalis::Expr::ASTNode> __l;
  ulong uVar2;
  value_type vVar3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  size_type sVar7;
  reference pvVar8;
  size_type sVar9;
  reference pdVar10;
  byte in_DL;
  size_type in_RSI;
  long in_RDI;
  double dVar11;
  Environment *env;
  pair<std::_Rb_tree_const_iterator<std::pair<double,_int>_>,_bool> pVar12;
  ASTNode AVar13;
  PointMarker ptm_1;
  size_t idx_2;
  double y_5;
  double x_6;
  iterator __end7;
  iterator __begin7;
  set<double,_std::less<double>,_std::allocator<double>_> *__range7;
  double root_2;
  double x_5;
  int sxd_2;
  set<double,_std::less<double>,_std::allocator<double>_> st_1;
  Expr diff_comp_expr;
  uint32_t other_var;
  Expr comp_expr;
  PointMarker ptm;
  size_t idx_1;
  double y_4;
  double x_4;
  iterator __end6;
  iterator __begin6;
  set<double,_std::less<double>,_std::allocator<double>_> *__range6;
  double root_1;
  double x_3;
  int sxd_1;
  set<double,_std::less<double>,_std::allocator<double>_> st;
  Expr diff_sub_expr;
  Expr sub_expr;
  int f2t_nomod;
  int ft_nomod;
  value_type *func2;
  size_t funcid2;
  CritPoint cpt_1;
  double y_3;
  CritPoint *x_2;
  iterator __end3_1;
  iterator __begin3_1;
  vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_> *__range3_1;
  double y_2;
  CritPoint *cpt;
  iterator __end3;
  iterator __begin3;
  set<std::pair<double,_int>,_std::less<std::pair<double,_int>_>,_std::allocator<std::pair<double,_int>_>_>
  *__range3;
  anon_class_56_7_ff8e18dd draw_extremum;
  vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_> to_erase;
  double eps_1;
  float sy_1;
  float sx_2;
  double yp2_1;
  double yp_1;
  double eps;
  double yp2;
  double yp;
  float sx_1;
  float sy;
  double y_1;
  double x_1;
  float sxd;
  float sx_end;
  float sx_begin;
  double x_end;
  double x_begin;
  bool connector;
  float discont_sx;
  int discont_type;
  double discont_x;
  float psy;
  float psx;
  pair<double,_int> *discontinuity;
  iterator __end1;
  iterator __begin1;
  set<std::pair<double,_int>,_std::less<std::pair<double,_int>_>,_std::allocator<std::pair<double,_int>_>_>
  *__range1;
  size_t as_idx;
  int prev_discont_type;
  float prev_discont_sx;
  double prev_discont_x;
  double boundary_x_not_nan_side;
  double mi_y;
  double mi;
  double hi;
  double lo;
  bool is_prev_y_nan;
  double extr;
  double ddy;
  double asymp;
  double root;
  double dy;
  bool is_y_nan;
  double y;
  double x;
  int sx;
  double prev_y;
  double prev_x;
  anon_class_48_6_1545724e draw_line;
  vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_> curr_line;
  anon_class_24_3_b7f96783 push_critpt_if_valid;
  anon_class_24_3_b7f96783 push_if_valid;
  size_t idx;
  set<std::pair<double,_int>,_std::less<std::pair<double,_int>_>,_std::allocator<std::pair<double,_int>_>_>
  roots_and_extrema;
  set<std::pair<double,_int>,_std::less<std::pair<double,_int>_>,_std::allocator<std::pair<double,_int>_>_>
  discont;
  double MIN_DIST_BETWEEN_ROOTS;
  float DISCONTINUITY_EPS;
  double ASYMPTOTE_CHECK_BOUNDARY_EPS;
  double ASYMPTOTE_CHECK_EPS;
  double ASYMPTOTE_CHECK_DELTA2;
  double ASYMPTOTE_CHECK_DELTA1;
  double DOMAIN_BISECTION_EPS;
  double NEWTON_SIDE_ALLOW;
  double EPS_ABS;
  double EPS_STEP;
  color ineq_color;
  value_type *func;
  uint64_t var;
  double ymax;
  double ymin;
  double xmax;
  double xmin;
  float shigh;
  float swid;
  double ydiff;
  double xdiff;
  bool find_all_crit_pts;
  undefined4 in_stack_fffffffffffff628;
  uint32_t in_stack_fffffffffffff62c;
  undefined4 in_stack_fffffffffffff630;
  undefined4 in_stack_fffffffffffff634;
  color *in_stack_fffffffffffff638;
  set<std::pair<double,_int>,_std::less<std::pair<double,_int>_>,_std::allocator<std::pair<double,_int>_>_>
  *in_stack_fffffffffffff640;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffff648;
  set<std::pair<double,_int>,_std::less<std::pair<double,_int>_>,_std::allocator<std::pair<double,_int>_>_>
  *in_stack_fffffffffffff650;
  allocator_type *in_stack_fffffffffffff658;
  vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *in_stack_fffffffffffff660
  ;
  float in_stack_fffffffffffff668;
  float in_stack_fffffffffffff66c;
  anon_class_48_6_1545724e *in_stack_fffffffffffff670;
  double in_stack_fffffffffffff678;
  anon_class_24_3_b7f96783 *in_stack_fffffffffffff680;
  set<std::pair<double,_int>,_std::less<std::pair<double,_int>_>,_std::allocator<std::pair<double,_int>_>_>
  *in_stack_fffffffffffff688;
  anon_class_24_3_b7f96783 *in_stack_fffffffffffff690;
  double in_stack_fffffffffffff698;
  anon_class_24_3_b7f96783 *in_stack_fffffffffffff6a0;
  undefined4 in_stack_fffffffffffff6a8;
  int in_stack_fffffffffffff6ac;
  vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
  *in_stack_fffffffffffff6b0;
  View *in_stack_fffffffffffff6b8;
  Environment *in_stack_fffffffffffff6c0;
  CritPoint *in_stack_fffffffffffff6c8;
  anon_class_56_7_ff8e18dd *in_stack_fffffffffffff6d0;
  anon_union_8_3_343d95dd_for_ASTNode_1 in_stack_fffffffffffff6d8;
  undefined4 local_91c;
  double local_8b8;
  ulong local_8a8;
  double local_850;
  double local_810;
  float local_7d8;
  value_type local_7b8;
  float local_7b0;
  double local_790;
  value_type local_6e8;
  bool local_6b1;
  set<std::pair<double,_int>,_std::less<std::pair<double,_int>_>,_std::allocator<std::pair<double,_int>_>_>
  *local_6b0;
  double local_6a8;
  undefined4 local_6a0;
  undefined8 local_698;
  undefined8 local_690;
  undefined8 local_688;
  undefined1 local_680;
  size_type local_678;
  double local_670;
  set<std::pair<double,_int>,_std::less<std::pair<double,_int>_>,_std::allocator<std::pair<double,_int>_>_>
  *local_668;
  _Self local_660;
  _Self local_658;
  undefined1 *local_650;
  double local_648;
  anon_class_24_3_b7f96783 *local_640;
  int local_634;
  undefined1 local_630 [96];
  vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_> local_5d0;
  undefined1 local_5b8 [32];
  uint32_t local_598 [2];
  anon_union_8_3_343d95dd_for_ASTNode_1 local_590;
  uint32_t *local_588;
  undefined8 local_580;
  undefined1 local_548 [56];
  pointer local_510;
  pointer local_508;
  string local_500;
  undefined1 local_4e0;
  pointer local_4d8;
  pointer local_4d0;
  pointer local_4c8;
  _Self local_4c0;
  _Self local_4b8;
  _Rb_tree_node_base *local_4b0;
  _Base_ptr local_4a8;
  double local_4a0;
  int local_494;
  _Rb_tree_node_base local_490;
  undefined4 local_45c;
  uint local_428;
  uint local_424;
  reference local_420;
  ulong local_418;
  anon_enum_32 local_40c;
  double local_408;
  pair<double,_int> local_400;
  double local_3f0;
  reference local_3e8;
  pair<double,_int> *local_3e0;
  __normal_iterator<std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>
  local_3d8;
  undefined1 *local_3d0;
  double local_3c8;
  reference local_3c0;
  _Self local_3b8;
  _Self local_3b0;
  undefined1 *local_3a8;
  allocator_type **local_398;
  reference local_390;
  byte *local_388;
  double *local_380;
  undefined1 *local_378;
  size_type *local_370;
  undefined1 local_368 [24];
  double local_350;
  float local_348;
  float local_344;
  double local_340;
  double local_338;
  double local_330;
  double local_328;
  double local_320;
  float local_318;
  float local_314;
  double local_310;
  value_type local_308;
  float local_2fc;
  float local_2f8;
  float local_2f4;
  double local_2f0;
  double local_2e8;
  byte local_2d9;
  float local_2d8;
  int local_2d4;
  double local_2d0;
  float local_2c8;
  float local_2c4;
  reference local_2c0;
  _Self local_2b8;
  _Self local_2b0;
  undefined1 *local_2a8;
  ulong local_2a0;
  int local_298;
  float local_294;
  double local_290;
  _Base_ptr local_288;
  undefined1 local_280;
  undefined4 local_274;
  _Base_ptr local_270;
  undefined1 local_268;
  undefined4 local_25c;
  double local_258;
  double local_250;
  double local_248;
  value_type local_240;
  value_type local_238;
  byte local_229;
  double local_228;
  double local_220;
  double local_218;
  double local_210;
  double local_208;
  byte local_1f9;
  double local_1f8;
  value_type local_1f0;
  int local_1e4;
  double local_1e0;
  value_type local_1d8;
  byte *local_1c0;
  vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_> *local_1b8;
  reference local_1b0;
  size_type *local_1a0;
  undefined1 *local_198;
  vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_> local_190;
  double *local_178;
  double *local_170;
  double *local_168;
  double *local_160;
  double *local_158;
  double *local_150;
  undefined8 local_148;
  undefined1 local_140 [48];
  undefined1 local_110 [48];
  double local_e0;
  float local_d4;
  double local_d0;
  double local_c8;
  double local_c0;
  double local_b8;
  double local_b0;
  double local_a8;
  double local_a0;
  double local_98;
  undefined1 local_90 [48];
  reference local_60;
  allocator_type *local_58;
  double local_50;
  double local_48;
  double local_40;
  double local_38;
  float local_30;
  float local_2c;
  double local_28;
  double local_20;
  bool local_12;
  byte local_11;
  size_type local_10 [2];
  
  local_11 = in_DL & 1;
  local_10[0] = in_RSI;
  sVar7 = std::vector<nivalis::Function,_std::allocator<nivalis::Function>_>::size
                    ((vector<nivalis::Function,_std::allocator<nivalis::Function>_> *)
                     (in_RDI + 0x40));
  local_6b1 = true;
  if (*(ulong *)(in_RDI + 0x130) < sVar7) {
    local_6b1 = local_10[0] == *(size_type *)(in_RDI + 0x30);
  }
  local_12 = local_6b1;
  local_20 = *(double *)(in_RDI + 0x10) - *(double *)(in_RDI + 0x18);
  local_28 = *(double *)(in_RDI + 0x20) - *(double *)(in_RDI + 0x28);
  local_2c = (float)*(int *)(in_RDI + 8);
  local_30 = (float)*(int *)(in_RDI + 0xc);
  local_38 = *(double *)(in_RDI + 0x18);
  local_40 = *(double *)(in_RDI + 0x10);
  local_48 = *(double *)(in_RDI + 0x28);
  local_50 = *(double *)(in_RDI + 0x20);
  local_58 = (allocator_type *)(ulong)*(uint *)(in_RDI + 0x310);
  if ((local_11 & 1) != 0) {
    std::swap<double>(&local_20,&local_28);
    std::swap<double>(&local_38,&local_48);
    std::swap<double>(&local_40,&local_50);
    std::swap<float>(&local_2c,&local_30);
    local_58 = (allocator_type *)(ulong)*(uint *)(in_RDI + 0x314);
  }
  local_60 = std::vector<nivalis::Function,_std::allocator<nivalis::Function>_>::operator[]
                       ((vector<nivalis::Function,_std::allocator<nivalis::Function>_> *)
                        (in_RDI + 0x40),local_10[0]);
  anon_unknown_1::get_ineq_color(in_stack_fffffffffffff638);
  local_98 = local_20 * 1e-07;
  local_a0 = local_28 * 1e-10;
  local_a8 = local_20 / 20.0;
  local_b0 = local_20 * 1e-09;
  local_b8 = local_20 * 1e-06;
  local_c0 = local_20 * 1e-05;
  local_c8 = local_28 * 1e-09;
  local_d0 = local_28 * 0.001;
  local_d4 = (float)(local_20 * 9.999999747378752e-05);
  local_e0 = local_20 * 1e-07;
  dVar11 = std::numeric_limits<double>::quiet_NaN();
  pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x140),
                      (ulong)*(uint *)(in_RDI + 0x314));
  *pvVar8 = dVar11;
  std::
  set<std::pair<double,_int>,_std::less<std::pair<double,_int>_>,_std::allocator<std::pair<double,_int>_>_>
  ::set((set<std::pair<double,_int>,_std::less<std::pair<double,_int>_>,_std::allocator<std::pair<double,_int>_>_>
         *)0x182684);
  std::
  set<std::pair<double,_int>,_std::less<std::pair<double,_int>_>,_std::allocator<std::pair<double,_int>_>_>
  ::set((set<std::pair<double,_int>,_std::less<std::pair<double,_int>_>,_std::allocator<std::pair<double,_int>_>_>
         *)0x182691);
  local_148 = 0;
  local_178 = &local_38;
  local_170 = &local_40;
  local_168 = &local_e0;
  local_160 = local_178;
  local_158 = local_170;
  local_150 = local_168;
  std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>::vector
            ((vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_> *)0x1826fa);
  local_1c0 = &local_11;
  local_1b0 = local_60;
  local_1a0 = local_10;
  local_1b8 = &local_190;
  local_198 = local_90;
  bVar4 = Expr::is_null((Expr *)in_stack_fffffffffffff640);
  if ((!bVar4) &&
     (sVar7 = std::vector<nivalis::Function,_std::allocator<nivalis::Function>_>::size
                        ((vector<nivalis::Function,_std::allocator<nivalis::Function>_> *)
                         (in_RDI + 0x40)), sVar7 <= *(ulong *)(in_RDI + 0x138))) {
    local_1e0 = 0.0;
    for (local_1e4 = 0; (float)local_1e4 < local_2c; local_1e4 = local_1e4 + 4) {
      if ((local_11 & 1) == 0) {
        local_6e8 = ((double)local_1e4 * 1.0 *
                    (*(double *)(in_RDI + 0x10) - *(double *)(in_RDI + 0x18))) /
                    (double)*(int *)(in_RDI + 8) + *(double *)(in_RDI + 0x18);
      }
      else {
        local_6e8 = ((double)(*(int *)(in_RDI + 0xc) - local_1e4) * 1.0 *
                    (*(double *)(in_RDI + 0x20) - *(double *)(in_RDI + 0x28))) /
                    (double)*(int *)(in_RDI + 0xc) + *(double *)(in_RDI + 0x28);
      }
      local_1f0 = local_6e8;
      pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x140),
                          (size_type)local_58);
      *pvVar8 = local_6e8;
      local_1f8 = Expr::operator()((Expr *)in_stack_fffffffffffff670,
                                   (Environment *)
                                   CONCAT44(in_stack_fffffffffffff66c,in_stack_fffffffffffff668));
      uVar5 = std::isnan(local_1f8);
      vVar3 = local_1f0;
      local_1f9 = (byte)uVar5 & 1;
      if ((uVar5 & 1) == 0) {
        pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x140),
                            (size_type)local_58);
        *pvVar8 = vVar3;
        local_208 = Expr::operator()((Expr *)in_stack_fffffffffffff670,
                                     (Environment *)
                                     CONCAT44(in_stack_fffffffffffff66c,in_stack_fffffffffffff668));
        uVar5 = std::isnan(local_208);
        if ((uVar5 & 1) == 0) {
          if ((local_12 & 1U) != 0) {
            local_210 = Expr::newton(in_stack_fffffffffffff6d8.val,
                                     (uint64_t)in_stack_fffffffffffff6d0,
                                     (double)in_stack_fffffffffffff6c8,in_stack_fffffffffffff6c0,
                                     (double)in_stack_fffffffffffff6b8,
                                     (double)in_stack_fffffffffffff6b0,in_stack_fffffffffffff6ac,
                                     (double)in_stack_fffffffffffff6a0,in_stack_fffffffffffff698,
                                     (Expr *)in_stack_fffffffffffff690,
                                     (double)in_stack_fffffffffffff688,
                                     (double)in_stack_fffffffffffff680);
            plot_explicit::anon_class_24_3_b7f96783::operator()
                      (in_stack_fffffffffffff6a0,in_stack_fffffffffffff698,
                       (second_type)((ulong)in_stack_fffffffffffff690 >> 0x20),
                       in_stack_fffffffffffff688);
          }
          local_218 = Expr::newton(in_stack_fffffffffffff6d8.val,(uint64_t)in_stack_fffffffffffff6d0
                                   ,(double)in_stack_fffffffffffff6c8,in_stack_fffffffffffff6c0,
                                   (double)in_stack_fffffffffffff6b8,
                                   (double)in_stack_fffffffffffff6b0,in_stack_fffffffffffff6ac,
                                   (double)in_stack_fffffffffffff6a0,in_stack_fffffffffffff698,
                                   (Expr *)in_stack_fffffffffffff690,
                                   (double)in_stack_fffffffffffff688,
                                   (double)in_stack_fffffffffffff680);
          plot_explicit::anon_class_24_3_b7f96783::operator()
                    (in_stack_fffffffffffff6a0,in_stack_fffffffffffff698,
                     (second_type)((ulong)in_stack_fffffffffffff690 >> 0x20),
                     in_stack_fffffffffffff688);
          vVar3 = local_1f0;
          if ((local_12 & 1U) != 0) {
            pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                               ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x140),
                                (size_type)local_58);
            *pvVar8 = vVar3;
            local_220 = Expr::operator()((Expr *)in_stack_fffffffffffff670,
                                         (Environment *)
                                         CONCAT44(in_stack_fffffffffffff66c,
                                                  in_stack_fffffffffffff668));
            uVar5 = std::isnan(local_220);
            if ((uVar5 & 1) == 0) {
              local_228 = Expr::newton(in_stack_fffffffffffff6d8.val,
                                       (uint64_t)in_stack_fffffffffffff6d0,
                                       (double)in_stack_fffffffffffff6c8,in_stack_fffffffffffff6c0,
                                       (double)in_stack_fffffffffffff6b8,
                                       (double)in_stack_fffffffffffff6b0,in_stack_fffffffffffff6ac,
                                       (double)in_stack_fffffffffffff6a0,in_stack_fffffffffffff698,
                                       (Expr *)in_stack_fffffffffffff690,
                                       (double)in_stack_fffffffffffff688,
                                       (double)in_stack_fffffffffffff680);
              plot_explicit::anon_class_24_3_b7f96783::operator()
                        (in_stack_fffffffffffff6a0,in_stack_fffffffffffff698,
                         (second_type)((ulong)in_stack_fffffffffffff690 >> 0x20),
                         in_stack_fffffffffffff688);
            }
          }
        }
      }
      if (local_1e4 != 0) {
        iVar6 = std::isnan(local_1e0);
        local_229 = (byte)iVar6 & 1;
        if ((local_1f9 & 1) != local_229) {
          local_238 = local_1d8;
          local_240 = local_1f0;
          while (local_b0 < local_240 - local_238) {
            dVar11 = (local_238 + local_240) * 0.5;
            local_248 = dVar11;
            pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                               ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x140),
                                (size_type)local_58);
            *pvVar8 = dVar11;
            local_250 = Expr::operator()((Expr *)in_stack_fffffffffffff670,
                                         (Environment *)
                                         CONCAT44(in_stack_fffffffffffff66c,
                                                  in_stack_fffffffffffff668));
            iVar6 = std::isnan(local_250);
            if (((byte)iVar6 & 1) == (local_229 & 1)) {
              local_238 = local_248;
            }
            else {
              local_240 = local_248;
            }
          }
          if ((local_229 & 1) == 0) {
            local_790 = local_238;
          }
          else {
            local_790 = local_240;
          }
          local_258 = local_790;
          plot_explicit::anon_class_24_3_b7f96783::operator()
                    (in_stack_fffffffffffff6a0,in_stack_fffffffffffff698,
                     (second_type)((ulong)in_stack_fffffffffffff690 >> 0x20),
                     in_stack_fffffffffffff688);
        }
      }
      local_1d8 = local_1f0;
      local_1e0 = local_1f8;
    }
  }
  local_25c = 2;
  pVar12 = std::
           set<std::pair<double,int>,std::less<std::pair<double,int>>,std::allocator<std::pair<double,int>>>
           ::emplace<double&,nivalis::Plotter::plot_explicit(unsigned_long,bool)::__0>
                     (in_stack_fffffffffffff650,(double *)in_stack_fffffffffffff648,
                      (anon_enum_32 *)in_stack_fffffffffffff640);
  local_270 = (_Base_ptr)pVar12.first._M_node;
  local_268 = pVar12.second;
  local_274 = 2;
  pVar12 = std::
           set<std::pair<double,int>,std::less<std::pair<double,int>>,std::allocator<std::pair<double,int>>>
           ::emplace<double&,nivalis::Plotter::plot_explicit(unsigned_long,bool)::__0>
                     (in_stack_fffffffffffff650,(double *)in_stack_fffffffffffff648,
                      (anon_enum_32 *)in_stack_fffffffffffff640);
  local_288 = (_Base_ptr)pVar12.first._M_node;
  local_280 = pVar12.second;
  local_290 = local_38;
  local_2a0 = 0;
  local_2a8 = local_110;
  local_2b0._M_node =
       (_Base_ptr)
       std::
       set<std::pair<double,_int>,_std::less<std::pair<double,_int>_>,_std::allocator<std::pair<double,_int>_>_>
       ::begin((set<std::pair<double,_int>,_std::less<std::pair<double,_int>_>,_std::allocator<std::pair<double,_int>_>_>
                *)CONCAT44(in_stack_fffffffffffff62c,in_stack_fffffffffffff628));
  local_2b8._M_node =
       (_Base_ptr)
       std::
       set<std::pair<double,_int>,_std::less<std::pair<double,_int>_>,_std::allocator<std::pair<double,_int>_>_>
       ::end((set<std::pair<double,_int>,_std::less<std::pair<double,_int>_>,_std::allocator<std::pair<double,_int>_>_>
              *)CONCAT44(in_stack_fffffffffffff62c,in_stack_fffffffffffff628));
  while (bVar4 = std::operator!=(&local_2b0,&local_2b8), bVar4) {
    local_2c0 = std::_Rb_tree_const_iterator<std::pair<double,_int>_>::operator*
                          ((_Rb_tree_const_iterator<std::pair<double,_int>_> *)0x1830b1);
    local_2c4 = -1.0;
    local_2c8 = -1.0;
    local_2d0 = local_2c0->first;
    local_2d4 = local_2c0->second;
    if ((local_11 & 1) == 0) {
      dVar11 = ((local_2d0 - *(double *)(in_RDI + 0x18)) * (double)*(int *)(in_RDI + 8)) /
               (*(double *)(in_RDI + 0x10) - *(double *)(in_RDI + 0x18));
    }
    else {
      dVar11 = ((*(double *)(in_RDI + 0x20) - local_2d0) * (double)*(int *)(in_RDI + 0xc)) /
               (*(double *)(in_RDI + 0x20) - *(double *)(in_RDI + 0x28));
    }
    local_7b0 = (float)dVar11;
    local_2d8 = local_7b0;
    if (local_2a0 != 0) {
      local_2d9 = local_298 != 2;
      local_2e8 = local_290;
      local_2f4 = local_294;
      local_2f8 = local_7b0;
      local_2f0 = local_2d0;
      if ((local_11 & 1) != 0) {
        std::swap<float>(&local_2f4,&local_2f8);
        std::swap<double>(&local_2e8,&local_2f0);
      }
      local_2fc = local_2f4 + local_d4;
      while (local_2fc < local_2f8 - local_d4) {
        if ((local_11 & 1) == 0) {
          local_7b8 = ((double)local_2fc * 1.0 *
                      (*(double *)(in_RDI + 0x10) - *(double *)(in_RDI + 0x18))) /
                      (double)*(int *)(in_RDI + 8) + *(double *)(in_RDI + 0x18);
        }
        else {
          local_7b8 = ((double)((float)*(int *)(in_RDI + 0xc) - local_2fc) * 1.0 *
                      (*(double *)(in_RDI + 0x20) - *(double *)(in_RDI + 0x28))) /
                      (double)*(int *)(in_RDI + 0xc) + *(double *)(in_RDI + 0x28);
        }
        local_308 = local_7b8;
        pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x140),
                            (size_type)local_58);
        *pvVar8 = local_7b8;
        local_310 = Expr::operator()((Expr *)in_stack_fffffffffffff670,
                                     (Environment *)
                                     CONCAT44(in_stack_fffffffffffff66c,in_stack_fffffffffffff668));
        uVar5 = std::isnan(local_310);
        if ((uVar5 & 1) == 0) {
          if (local_310 <= local_50 + local_28) {
            if (local_310 < local_48 - local_28) {
              local_310 = local_48 - local_28;
            }
          }
          else {
            local_310 = local_50 + local_28;
          }
          if ((local_11 & 1) == 0) {
            dVar11 = ((*(double *)(in_RDI + 0x20) - local_310) * (double)*(int *)(in_RDI + 0xc)) /
                     (*(double *)(in_RDI + 0x20) - *(double *)(in_RDI + 0x28));
          }
          else {
            dVar11 = ((local_310 - *(double *)(in_RDI + 0x18)) * (double)*(int *)(in_RDI + 8)) /
                     (*(double *)(in_RDI + 0x10) - *(double *)(in_RDI + 0x18));
          }
          local_7d8 = (float)dVar11;
          local_314 = local_7d8;
          local_318 = local_2fc;
          if ((local_2d9 & 1) != 0) {
            local_2d9 = 0;
            dVar11 = local_2e8 + local_b8;
            pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                               ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x140),
                                (size_type)local_58);
            *pvVar8 = dVar11;
            local_320 = Expr::operator()((Expr *)in_stack_fffffffffffff670,
                                         (Environment *)
                                         CONCAT44(in_stack_fffffffffffff66c,
                                                  in_stack_fffffffffffff668));
            dVar11 = local_2e8 + local_c0;
            pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                               ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x140),
                                (size_type)local_58);
            *pvVar8 = dVar11;
            local_328 = Expr::operator()((Expr *)in_stack_fffffffffffff670,
                                         (Environment *)
                                         CONCAT44(in_stack_fffffffffffff66c,
                                                  in_stack_fffffffffffff668));
            if (local_2d4 == 0) {
              local_810 = local_c8;
            }
            else {
              local_810 = local_d0;
            }
            local_330 = local_810;
            if ((local_320 - local_328 <= local_810) || (local_314 <= 0.0)) {
              if ((local_320 - local_328 < -local_810) && (local_314 < local_30)) {
                local_2c4 = local_2f4;
                local_2c8 = local_30;
              }
            }
            else {
              local_2c4 = local_2f4;
              local_2c8 = 0.0;
            }
          }
          if (0.0 <= local_2c4) {
            plot_explicit::anon_class_48_6_1545724e::operator()
                      (in_stack_fffffffffffff670,in_stack_fffffffffffff66c,in_stack_fffffffffffff668
                       ,(float)((ulong)in_stack_fffffffffffff660 >> 0x20),
                       SUB84(in_stack_fffffffffffff660,0));
          }
          local_2c4 = local_318;
          local_2c8 = local_314;
        }
        else {
          local_2c4 = -1.0;
        }
        sVar9 = std::
                set<std::pair<double,_int>,_std::less<std::pair<double,_int>_>,_std::allocator<std::pair<double,_int>_>_>
                ::size((set<std::pair<double,_int>,_std::less<std::pair<double,_int>_>,_std::allocator<std::pair<double,_int>_>_>
                        *)0x18379a);
        if ((sVar9 < 3) ||
           (sVar9 = std::
                    set<std::pair<double,_int>,_std::less<std::pair<double,_int>_>,_std::allocator<std::pair<double,_int>_>_>
                    ::size((set<std::pair<double,_int>,_std::less<std::pair<double,_int>_>,_std::allocator<std::pair<double,_int>_>_>
                            *)0x1837b1), uVar2 = local_2a0, 99 < sVar9)) {
          local_2fc = local_2fc + 0.2;
        }
        else if (((1 < local_2a0) && (local_2fc - local_294 < 1.0)) ||
                ((sVar9 = std::
                          set<std::pair<double,_int>,_std::less<std::pair<double,_int>_>,_std::allocator<std::pair<double,_int>_>_>
                          ::size((set<std::pair<double,_int>,_std::less<std::pair<double,_int>_>,_std::allocator<std::pair<double,_int>_>_>
                                  *)0x183807), uVar2 < sVar9 - 1 && (local_2d8 - local_2fc < 1.0))))
        {
          local_2fc = local_2fc + 0.1;
        }
        else {
          local_2fc = local_2fc + 0.2;
        }
      }
      if (local_2d4 != 2) {
        dVar11 = local_2f0 - local_b8;
        pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x140),
                            (size_type)local_58);
        *pvVar8 = dVar11;
        local_338 = Expr::operator()((Expr *)in_stack_fffffffffffff670,
                                     (Environment *)
                                     CONCAT44(in_stack_fffffffffffff66c,in_stack_fffffffffffff668));
        dVar11 = local_2f0 - local_c0;
        pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x140),
                            (size_type)local_58);
        *pvVar8 = dVar11;
        local_340 = Expr::operator()((Expr *)in_stack_fffffffffffff670,
                                     (Environment *)
                                     CONCAT44(in_stack_fffffffffffff66c,in_stack_fffffffffffff668));
        local_344 = -1.0;
        if (local_2d4 == 0) {
          local_850 = local_c8;
        }
        else {
          local_850 = local_d0;
        }
        local_350 = local_850;
        if ((local_850 < local_338 - local_340) && (0.0 < local_2c8)) {
          local_344 = local_2f8;
          local_348 = 0.0;
        }
        if ((local_338 - local_340 < -local_850) && (local_2c8 < local_30)) {
          local_344 = local_2f8;
          local_348 = local_30;
        }
        if ((0.0 <= local_2c4) && (0.0 <= local_344)) {
          plot_explicit::anon_class_48_6_1545724e::operator()
                    (in_stack_fffffffffffff670,in_stack_fffffffffffff66c,in_stack_fffffffffffff668,
                     (float)((ulong)in_stack_fffffffffffff660 >> 0x20),
                     SUB84(in_stack_fffffffffffff660,0));
        }
      }
    }
    local_2a0 = local_2a0 + 1;
    local_290 = local_2d0;
    local_298 = local_2d4;
    local_294 = local_2d8;
    std::_Rb_tree_const_iterator<std::pair<double,_int>_>::operator++
              ((_Rb_tree_const_iterator<std::pair<double,_int>_> *)
               CONCAT44(in_stack_fffffffffffff634,in_stack_fffffffffffff630));
  }
  sVar7 = std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>::size
                    (&local_190);
  if ((1 < sVar7) && ((local_60->type & 2U) == 0)) {
    in_stack_fffffffffffff630 = 0;
    in_stack_fffffffffffff628 = 1;
    anon_unknown_1::buf_add_screen_polyline
              ((vector<nivalis::DrawBufferObject,_std::allocator<nivalis::DrawBufferObject>_> *)
               in_stack_fffffffffffff6c0,in_stack_fffffffffffff6b8,in_stack_fffffffffffff6b0,
               (color *)CONCAT44(in_stack_fffffffffffff6ac,in_stack_fffffffffffff6a8),
               (size_t)in_stack_fffffffffffff6a0,(float)((ulong)in_stack_fffffffffffff698 >> 0x20),
               SUB81((ulong)in_stack_fffffffffffff698 >> 0x18,0),
               SUB81((ulong)in_stack_fffffffffffff698 >> 0x10,0),
               SUB81((ulong)in_stack_fffffffffffff698 >> 8,0));
  }
  sVar7 = std::vector<nivalis::Function,_std::allocator<nivalis::Function>_>::size
                    ((vector<nivalis::Function,_std::allocator<nivalis::Function>_> *)
                     (in_RDI + 0x40));
  if (sVar7 <= *(ulong *)(in_RDI + 0x138)) {
    if ((local_12 & 1U) != 0) {
      std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::vector
                ((vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_> *)
                 0x183c32);
      local_398 = &local_58;
      local_390 = local_60;
      local_388 = &local_11;
      local_380 = &local_28;
      local_378 = local_368;
      local_370 = local_10;
      local_3a8 = local_140;
      local_3b0._M_node =
           (_Base_ptr)
           std::
           set<std::pair<double,_int>,_std::less<std::pair<double,_int>_>,_std::allocator<std::pair<double,_int>_>_>
           ::begin((set<std::pair<double,_int>,_std::less<std::pair<double,_int>_>,_std::allocator<std::pair<double,_int>_>_>
                    *)CONCAT44(in_stack_fffffffffffff62c,in_stack_fffffffffffff628));
      local_3b8._M_node =
           (_Base_ptr)
           std::
           set<std::pair<double,_int>,_std::less<std::pair<double,_int>_>,_std::allocator<std::pair<double,_int>_>_>
           ::end((set<std::pair<double,_int>,_std::less<std::pair<double,_int>_>,_std::allocator<std::pair<double,_int>_>_>
                  *)CONCAT44(in_stack_fffffffffffff62c,in_stack_fffffffffffff628));
      while (bVar4 = std::operator!=(&local_3b0,&local_3b8), bVar4) {
        local_3c0 = std::_Rb_tree_const_iterator<std::pair<double,_int>_>::operator*
                              ((_Rb_tree_const_iterator<std::pair<double,_int>_> *)0x183d07);
        dVar11 = local_3c0->first;
        pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x140),
                            (size_type)local_58);
        *pvVar8 = dVar11;
        local_3c8 = Expr::operator()((Expr *)in_stack_fffffffffffff670,
                                     (Environment *)
                                     CONCAT44(in_stack_fffffffffffff66c,in_stack_fffffffffffff668));
        plot_explicit::anon_class_56_7_ff8e18dd::operator()
                  (in_stack_fffffffffffff6d0,in_stack_fffffffffffff6c8,
                   (double)in_stack_fffffffffffff6c0);
        std::_Rb_tree_const_iterator<std::pair<double,_int>_>::operator++
                  ((_Rb_tree_const_iterator<std::pair<double,_int>_> *)
                   CONCAT44(in_stack_fffffffffffff634,in_stack_fffffffffffff630));
      }
      local_3d0 = local_368;
      local_3d8._M_current =
           (pair<double,_int> *)
           std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::begin
                     ((vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_> *)
                      CONCAT44(in_stack_fffffffffffff62c,in_stack_fffffffffffff628));
      local_3e0 = (pair<double,_int> *)
                  std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::end
                            ((vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                              *)CONCAT44(in_stack_fffffffffffff62c,in_stack_fffffffffffff628));
      while (bVar4 = __gnu_cxx::operator!=
                               ((__normal_iterator<std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>
                                 *)CONCAT44(in_stack_fffffffffffff634,in_stack_fffffffffffff630),
                                (__normal_iterator<std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>
                                 *)CONCAT44(in_stack_fffffffffffff62c,in_stack_fffffffffffff628)),
            bVar4) {
        local_3e8 = __gnu_cxx::
                    __normal_iterator<std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>
                    ::operator*(&local_3d8);
        std::
        set<std::pair<double,_int>,_std::less<std::pair<double,_int>_>,_std::allocator<std::pair<double,_int>_>_>
        ::erase((set<std::pair<double,_int>,_std::less<std::pair<double,_int>_>,_std::allocator<std::pair<double,_int>_>_>
                 *)CONCAT44(in_stack_fffffffffffff634,in_stack_fffffffffffff630),
                (key_type *)CONCAT44(in_stack_fffffffffffff62c,in_stack_fffffffffffff628));
        __gnu_cxx::
        __normal_iterator<std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>
        ::operator++(&local_3d8);
      }
      bVar4 = Expr::is_null((Expr *)in_stack_fffffffffffff640);
      if ((!bVar4) && (bVar4 = Expr::is_null((Expr *)in_stack_fffffffffffff640), !bVar4)) {
        pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x140),
                            (size_type)local_58);
        *pvVar8 = 0.0;
        local_3f0 = Expr::operator()((Expr *)in_stack_fffffffffffff670,
                                     (Environment *)
                                     CONCAT44(in_stack_fffffffffffff66c,in_stack_fffffffffffff668));
        uVar5 = std::isnan(local_3f0);
        if (((uVar5 & 1) == 0) && (uVar5 = std::isinf(local_3f0), (uVar5 & 1) == 0)) {
          plot_explicit::anon_class_24_3_b7f96783::operator()
                    (in_stack_fffffffffffff6a0,in_stack_fffffffffffff698,
                     (second_type)((ulong)in_stack_fffffffffffff690 >> 0x20),
                     in_stack_fffffffffffff688);
          local_408 = 0.0;
          local_40c = Y_INT;
          std::pair<double,_int>::
          pair<double,_(unnamed_enum_at__workspace_llm4binary_github_license_c_cmakelists_sxyu[P]nivalis_src_plotter_render_cpp:852:5),_true>
                    (&local_400,&local_408,&local_40c);
          sVar9 = std::
                  set<std::pair<double,_int>,_std::less<std::pair<double,_int>_>,_std::allocator<std::pair<double,_int>_>_>
                  ::count(in_stack_fffffffffffff640,(key_type *)in_stack_fffffffffffff638);
          if (sVar9 != 0) {
            plot_explicit::anon_class_56_7_ff8e18dd::operator()
                      (in_stack_fffffffffffff6d0,in_stack_fffffffffffff6c8,
                       (double)in_stack_fffffffffffff6c0);
          }
        }
      }
      std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::~vector
                ((vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_> *)
                 in_stack_fffffffffffff640);
    }
    bVar4 = Expr::is_null((Expr *)in_stack_fffffffffffff640);
    if (!bVar4) {
      sVar7 = std::vector<nivalis::Function,_std::allocator<nivalis::Function>_>::size
                        ((vector<nivalis::Function,_std::allocator<nivalis::Function>_> *)
                         (in_RDI + 0x40));
      env = (Environment *)CONCAT44(in_stack_fffffffffffff66c,in_stack_fffffffffffff668);
      if ((sVar7 <= *(ulong *)(in_RDI + 0x138)) && ((local_12 & 1U) != 0)) {
        local_418 = 0;
        while( true ) {
          uVar2 = local_418;
          sVar7 = std::vector<nivalis::Function,_std::allocator<nivalis::Function>_>::size
                            ((vector<nivalis::Function,_std::allocator<nivalis::Function>_> *)
                             (in_RDI + 0x40));
          if (*(ulong *)(in_RDI + 0x130) < sVar7) {
            local_8a8 = std::vector<nivalis::Function,_std::allocator<nivalis::Function>_>::size
                                  ((vector<nivalis::Function,_std::allocator<nivalis::Function>_> *)
                                   (in_RDI + 0x40));
          }
          else {
            local_8a8 = local_10[0];
          }
          if (local_8a8 <= uVar2) break;
          local_420 = std::vector<nivalis::Function,_std::allocator<nivalis::Function>_>::operator[]
                                ((vector<nivalis::Function,_std::allocator<nivalis::Function>_> *)
                                 (in_RDI + 0x40),local_418);
          bVar4 = Expr::is_null((Expr *)in_stack_fffffffffffff640);
          if (!bVar4) {
            local_424 = local_60->type & 0xfffffff8;
            local_428 = local_420->type & 0xfffffff8;
            if (local_424 == local_428) {
              Expr::operator-((Expr *)in_stack_fffffffffffff638,
                              (Expr *)CONCAT44(in_stack_fffffffffffff634,in_stack_fffffffffffff630))
              ;
              Expr::operator-((Expr *)in_stack_fffffffffffff638,
                              (Expr *)CONCAT44(in_stack_fffffffffffff634,in_stack_fffffffffffff630))
              ;
              bVar4 = Expr::is_null((Expr *)in_stack_fffffffffffff640);
              if (bVar4) {
                local_45c = 0x11;
              }
              else {
                std::set<double,_std::less<double>,_std::allocator<double>_>::set
                          ((set<double,_std::less<double>,_std::allocator<double>_> *)0x18426e);
                for (local_494 = 0; (float)local_494 < local_2c; local_494 = local_494 + 10) {
                  if ((local_11 & 1) == 0) {
                    local_8b8 = ((double)local_494 * 1.0 *
                                (*(double *)(in_RDI + 0x10) - *(double *)(in_RDI + 0x18))) /
                                (double)*(int *)(in_RDI + 8) + *(double *)(in_RDI + 0x18);
                  }
                  else {
                    local_8b8 = ((double)(*(int *)(in_RDI + 0xc) - local_494) * 1.0 *
                                (*(double *)(in_RDI + 0x20) - *(double *)(in_RDI + 0x28))) /
                                (double)*(int *)(in_RDI + 0xc) + *(double *)(in_RDI + 0x28);
                  }
                  local_4a0 = local_8b8;
                  std::numeric_limits<double>::max();
                  std::numeric_limits<double>::max();
                  local_4a8 = (_Base_ptr)
                              Expr::newton((Expr *)in_stack_fffffffffffff6d8,
                                           (uint64_t)in_stack_fffffffffffff6d0,
                                           (double)in_stack_fffffffffffff6c8,
                                           in_stack_fffffffffffff6c0,
                                           (double)in_stack_fffffffffffff6b8,
                                           (double)in_stack_fffffffffffff6b0,
                                           in_stack_fffffffffffff6ac,
                                           (double)in_stack_fffffffffffff6a0,
                                           in_stack_fffffffffffff698,
                                           (Expr *)in_stack_fffffffffffff690,
                                           (double)in_stack_fffffffffffff688,
                                           (double)in_stack_fffffffffffff680);
                  plot_explicit::anon_class_24_3_b7f96783::operator()
                            (in_stack_fffffffffffff680,in_stack_fffffffffffff678,
                             (set<double,_std::less<double>,_std::allocator<double>_> *)
                             in_stack_fffffffffffff670);
                }
                local_4b0 = &local_490;
                local_4b8._M_node =
                     (_Base_ptr)
                     std::set<double,_std::less<double>,_std::allocator<double>_>::begin
                               ((set<double,_std::less<double>,_std::allocator<double>_> *)
                                CONCAT44(in_stack_fffffffffffff62c,in_stack_fffffffffffff628));
                local_4c0._M_node =
                     (_Base_ptr)
                     std::set<double,_std::less<double>,_std::allocator<double>_>::end
                               ((set<double,_std::less<double>,_std::allocator<double>_> *)
                                CONCAT44(in_stack_fffffffffffff62c,in_stack_fffffffffffff628));
                while (bVar4 = std::operator!=(&local_4b8,&local_4c0), bVar4) {
                  pdVar10 = std::_Rb_tree_const_iterator<double>::operator*
                                      ((_Rb_tree_const_iterator<double> *)0x184522);
                  pUVar1 = (pointer)*pdVar10;
                  local_4c8 = pUVar1;
                  pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                                     ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x140),
                                      (size_type)local_58);
                  *pvVar8 = (value_type)pUVar1;
                  local_4d0 = (pointer)Expr::operator()((Expr *)in_stack_fffffffffffff670,env);
                  local_4d8 = (pointer)std::
                                       vector<nivalis::PointMarker,_std::allocator<nivalis::PointMarker>_>
                                       ::size((vector<nivalis::PointMarker,_std::allocator<nivalis::PointMarker>_>
                                               *)(in_RDI + 0x280));
                  local_500._M_dataplus = (_Alloc_hider)0x5;
                  local_500._1_3_ = 0;
                  local_510 = local_4c8;
                  local_508 = local_4d0;
                  if ((local_11 & 1) != 0) {
                    std::swap<double>((double *)&local_510,(double *)&local_508);
                  }
                  local_4e0 = 0;
                  local_500._M_string_length = 0xffffffffffffffff;
                  local_500.field_2._8_8_ = 0xffffffffffffffff;
                  local_500.field_2._M_allocated_capacity = 0xffffffffffffffff;
                  std::vector<nivalis::PointMarker,_std::allocator<nivalis::PointMarker>_>::
                  push_back((vector<nivalis::PointMarker,_std::allocator<nivalis::PointMarker>_> *)
                            CONCAT44(in_stack_fffffffffffff634,in_stack_fffffffffffff630),
                            (value_type *)
                            CONCAT44(in_stack_fffffffffffff62c,in_stack_fffffffffffff628));
                  std::_Rb_tree_const_iterator<double>::operator++
                            ((_Rb_tree_const_iterator<double> *)
                             CONCAT44(in_stack_fffffffffffff634,in_stack_fffffffffffff630));
                }
                std::set<double,_std::less<double>,_std::allocator<double>_>::~set
                          ((set<double,_std::less<double>,_std::allocator<double>_> *)0x184681);
                local_45c = 0;
              }
              Expr::~Expr((Expr *)0x184699);
              Expr::~Expr((Expr *)0x1846a6);
            }
            else if (local_424 + local_428 == 8) {
              Expr::Expr((Expr *)CONCAT44(in_stack_fffffffffffff634,in_stack_fffffffffffff630),
                         (Expr *)CONCAT44(in_stack_fffffffffffff62c,in_stack_fffffffffffff628));
              if (local_58 == (allocator_type *)(ulong)*(uint *)(in_RDI + 0x310)) {
                local_91c = *(undefined4 *)(in_RDI + 0x314);
              }
              else {
                local_91c = *(undefined4 *)(in_RDI + 0x310);
              }
              local_548._28_4_ = local_91c;
              Expr::sub_var((Expr *)CONCAT44(in_stack_fffffffffffff634,in_stack_fffffffffffff630),
                            in_stack_fffffffffffff62c,(Expr *)0x184783);
              AVar13 = Expr::ASTNode::varref(0x184792);
              in_stack_fffffffffffff6d8 = AVar13.field_1;
              local_598[0] = AVar13.opcode;
              local_588 = local_598;
              local_580 = 1;
              in_stack_fffffffffffff6d0 = (anon_class_56_7_ff8e18dd *)(local_5b8 + 0x1f);
              local_590.ref = in_stack_fffffffffffff6d8.ref;
              std::allocator<nivalis::Expr::ASTNode>::allocator
                        ((allocator<nivalis::Expr::ASTNode> *)0x1847f2);
              __l._M_len = (size_type)in_stack_fffffffffffff670;
              __l._M_array = (iterator)env;
              std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::vector
                        (in_stack_fffffffffffff660,__l,in_stack_fffffffffffff658);
              Expr::Expr((Expr *)CONCAT44(in_stack_fffffffffffff634,in_stack_fffffffffffff630),
                         (AST *)CONCAT44(in_stack_fffffffffffff62c,in_stack_fffffffffffff628));
              Expr::operator-((Expr *)in_stack_fffffffffffff638,
                              (Expr *)CONCAT44(in_stack_fffffffffffff634,in_stack_fffffffffffff630))
              ;
              in_stack_fffffffffffff6c8 = (CritPoint *)(local_548 + 0x20);
              in_stack_fffffffffffff6c0 = (Environment *)local_548;
              Expr::operator=((Expr *)CONCAT44(in_stack_fffffffffffff634,in_stack_fffffffffffff630),
                              (Expr *)CONCAT44(in_stack_fffffffffffff62c,in_stack_fffffffffffff628))
              ;
              Expr::~Expr((Expr *)0x184881);
              Expr::~Expr((Expr *)0x18488e);
              std::vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_>::~vector
                        ((vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                         in_stack_fffffffffffff640);
              std::allocator<nivalis::Expr::ASTNode>::~allocator
                        ((allocator<nivalis::Expr::ASTNode> *)0x1848a8);
              Expr::optimize((Expr *)in_stack_fffffffffffff6a0,
                             (int)((ulong)in_stack_fffffffffffff698 >> 0x20));
              Expr::Expr((Expr *)CONCAT44(in_stack_fffffffffffff634,in_stack_fffffffffffff630),
                         (Expr *)CONCAT44(in_stack_fffffffffffff62c,in_stack_fffffffffffff628));
              Expr::sub_var((Expr *)CONCAT44(in_stack_fffffffffffff634,in_stack_fffffffffffff630),
                            in_stack_fffffffffffff62c,(Expr *)0x1848fa);
              Expr::operator*((Expr *)in_stack_fffffffffffff638,
                              (Expr *)CONCAT44(in_stack_fffffffffffff634,in_stack_fffffffffffff630))
              ;
              Expr::constant((double)in_stack_fffffffffffff648);
              Expr::operator-((Expr *)in_stack_fffffffffffff638,
                              (Expr *)CONCAT44(in_stack_fffffffffffff634,in_stack_fffffffffffff630))
              ;
              in_stack_fffffffffffff6b8 = (View *)local_5b8;
              in_stack_fffffffffffff6b0 = &local_5d0;
              Expr::operator=((Expr *)CONCAT44(in_stack_fffffffffffff634,in_stack_fffffffffffff630),
                              (Expr *)CONCAT44(in_stack_fffffffffffff62c,in_stack_fffffffffffff628))
              ;
              Expr::~Expr((Expr *)0x18498a);
              Expr::~Expr((Expr *)0x184997);
              Expr::~Expr((Expr *)0x1849a4);
              Expr::optimize((Expr *)in_stack_fffffffffffff6a0,
                             (int)((ulong)in_stack_fffffffffffff698 >> 0x20));
              bVar4 = Expr::is_null((Expr *)in_stack_fffffffffffff640);
              in_stack_fffffffffffff6ac = CONCAT13(bVar4,(int3)in_stack_fffffffffffff6ac);
              if (bVar4) {
                local_45c = 0x11;
              }
              else {
                std::set<double,_std::less<double>,_std::allocator<double>_>::set
                          ((set<double,_std::less<double>,_std::allocator<double>_> *)0x184ae2);
                for (local_634 = 0; (float)local_634 < local_2c; local_634 = local_634 + 2) {
                  if ((local_11 & 1) == 0) {
                    in_stack_fffffffffffff690 =
                         (anon_class_24_3_b7f96783 *)
                         (((double)local_634 * 1.0 *
                          (*(double *)(in_RDI + 0x10) - *(double *)(in_RDI + 0x18))) /
                          (double)*(int *)(in_RDI + 8) + *(double *)(in_RDI + 0x18));
                  }
                  else {
                    in_stack_fffffffffffff690 =
                         (anon_class_24_3_b7f96783 *)
                         (((double)(*(int *)(in_RDI + 0xc) - local_634) * 1.0 *
                          (*(double *)(in_RDI + 0x20) - *(double *)(in_RDI + 0x28))) /
                          (double)*(int *)(in_RDI + 0xc) + *(double *)(in_RDI + 0x28));
                  }
                  in_stack_fffffffffffff660 =
                       (vector<nivalis::Expr::ASTNode,_std::allocator<nivalis::Expr::ASTNode>_> *)
                       (in_RDI + 0x140);
                  env = (Environment *)(local_98 * 10.0);
                  in_stack_fffffffffffff670 = (anon_class_48_6_1545724e *)(local_a0 * 10.0);
                  in_stack_fffffffffffff678 = local_38 - local_a8;
                  in_stack_fffffffffffff680 = (anon_class_24_3_b7f96783 *)(local_40 + local_a8);
                  in_stack_fffffffffffff658 = local_58;
                  in_stack_fffffffffffff6a0 = in_stack_fffffffffffff690;
                  local_640 = in_stack_fffffffffffff690;
                  in_stack_fffffffffffff688 =
                       (set<std::pair<double,_int>,_std::less<std::pair<double,_int>_>,_std::allocator<std::pair<double,_int>_>_>
                        *)std::numeric_limits<double>::max();
                  std::numeric_limits<double>::max();
                  in_stack_fffffffffffff698 =
                       Expr::newton(in_stack_fffffffffffff6d8.val,
                                    (uint64_t)in_stack_fffffffffffff6d0,
                                    (double)in_stack_fffffffffffff6c8,in_stack_fffffffffffff6c0,
                                    (double)in_stack_fffffffffffff6b8,
                                    (double)in_stack_fffffffffffff6b0,in_stack_fffffffffffff6ac,
                                    (double)in_stack_fffffffffffff6a0,in_stack_fffffffffffff698,
                                    (Expr *)in_stack_fffffffffffff690,
                                    (double)in_stack_fffffffffffff688,
                                    (double)in_stack_fffffffffffff680);
                  local_648 = in_stack_fffffffffffff698;
                  plot_explicit::anon_class_24_3_b7f96783::operator()
                            (in_stack_fffffffffffff680,in_stack_fffffffffffff678,
                             (set<double,_std::less<double>,_std::allocator<double>_> *)
                             in_stack_fffffffffffff670);
                }
                local_650 = local_630;
                local_658._M_node =
                     (_Base_ptr)
                     std::set<double,_std::less<double>,_std::allocator<double>_>::begin
                               ((set<double,_std::less<double>,_std::allocator<double>_> *)
                                CONCAT44(in_stack_fffffffffffff62c,in_stack_fffffffffffff628));
                local_660._M_node =
                     (_Base_ptr)
                     std::set<double,_std::less<double>,_std::allocator<double>_>::end
                               ((set<double,_std::less<double>,_std::allocator<double>_> *)
                                CONCAT44(in_stack_fffffffffffff62c,in_stack_fffffffffffff628));
                while (bVar4 = std::operator!=(&local_658,&local_660), bVar4) {
                  pdVar10 = std::_Rb_tree_const_iterator<double>::operator*
                                      ((_Rb_tree_const_iterator<double> *)0x184d67);
                  in_stack_fffffffffffff640 =
                       (set<std::pair<double,_int>,_std::less<std::pair<double,_int>_>,_std::allocator<std::pair<double,_int>_>_>
                        *)*pdVar10;
                  in_stack_fffffffffffff648 =
                       (vector<double,_std::allocator<double>_> *)(in_RDI + 0x140);
                  local_668 = in_stack_fffffffffffff640;
                  pvVar8 = std::vector<double,_std::allocator<double>_>::operator[]
                                     (in_stack_fffffffffffff648,(size_type)local_58);
                  *pvVar8 = (value_type)in_stack_fffffffffffff640;
                  local_670 = Expr::operator()((Expr *)in_stack_fffffffffffff670,env);
                  local_678 = std::
                              vector<nivalis::PointMarker,_std::allocator<nivalis::PointMarker>_>::
                              size((vector<nivalis::PointMarker,_std::allocator<nivalis::PointMarker>_>
                                    *)(in_RDI + 0x280));
                  local_6a0 = 5;
                  local_6b0 = local_668;
                  local_6a8 = local_670;
                  if ((local_11 & 1) != 0) {
                    std::swap<double>((double *)&local_6b0,&local_6a8);
                  }
                  local_680 = 0;
                  local_698 = 0xffffffffffffffff;
                  local_688 = 0xffffffffffffffff;
                  local_690 = 0xffffffffffffffff;
                  std::vector<nivalis::PointMarker,_std::allocator<nivalis::PointMarker>_>::
                  push_back((vector<nivalis::PointMarker,_std::allocator<nivalis::PointMarker>_> *)
                            CONCAT44(in_stack_fffffffffffff634,in_stack_fffffffffffff630),
                            (value_type *)
                            CONCAT44(in_stack_fffffffffffff62c,in_stack_fffffffffffff628));
                  std::_Rb_tree_const_iterator<double>::operator++
                            ((_Rb_tree_const_iterator<double> *)
                             CONCAT44(in_stack_fffffffffffff634,in_stack_fffffffffffff630));
                }
                std::set<double,_std::less<double>,_std::allocator<double>_>::~set
                          ((set<double,_std::less<double>,_std::allocator<double>_> *)0x184eb4);
                local_45c = 0;
              }
              Expr::~Expr((Expr *)0x184ecc);
              Expr::~Expr((Expr *)0x184ed9);
            }
          }
          local_418 = local_418 + 1;
        }
      }
    }
  }
  std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>::~vector
            ((vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_> *)
             in_stack_fffffffffffff640);
  std::
  set<std::pair<double,_int>,_std::less<std::pair<double,_int>_>,_std::allocator<std::pair<double,_int>_>_>
  ::~set((set<std::pair<double,_int>,_std::less<std::pair<double,_int>_>,_std::allocator<std::pair<double,_int>_>_>
          *)0x184f43);
  std::
  set<std::pair<double,_int>,_std::less<std::pair<double,_int>_>,_std::allocator<std::pair<double,_int>_>_>
  ::~set((set<std::pair<double,_int>,_std::less<std::pair<double,_int>_>,_std::allocator<std::pair<double,_int>_>_>
          *)0x184f50);
  return;
}

Assistant:

void Plotter::plot_explicit(size_t funcid, bool reverse_xy) {
    const bool find_all_crit_pts = funcs.size() <= max_functions_find_all_crit_points
                                     || funcid == curr_func;

    double xdiff = view.xmax - view.xmin, ydiff = view.ymax - view.ymin;
    float swid = view.swid, shigh = view.shigh;
    double xmin = view.xmin, xmax = view.xmax;
    double ymin = view.ymin, ymax = view.ymax;
    uint64_t var = x_var;
    if (reverse_xy) {
        std::swap(xdiff, ydiff);
        std::swap(xmin, ymin);
        std::swap(xmax, ymax);
        std::swap(swid, shigh);
        var = y_var;
    }
    auto& func = funcs[funcid];
    color::color ineq_color = get_ineq_color(func.line_color);


    // Constants
    // Newton's method parameters
    const double EPS_STEP  = 1e-7 * xdiff;
    const double EPS_ABS   = 1e-10 * ydiff;
    static const int MAX_ITER  = 100;
    // Shorthand for Newton's method arguments
#define NEWTON_ARGS var, x, env, EPS_STEP, EPS_ABS, MAX_ITER, \
    xmin - NEWTON_SIDE_ALLOW, xmax + NEWTON_SIDE_ALLOW
    // Amount x-coordinate is allowed to exceed the display boundaries
    const double NEWTON_SIDE_ALLOW = xdiff / 20.;


    // x-epsilon for domain bisection
    // (finding cutoff where function becomes undefined)
    const double DOMAIN_BISECTION_EPS = 1e-9 * xdiff;

    // Asymptote check constants:
    // Assume asymptote at discontinuity if slope between
    // x + ASYMPTOTE_CHECK_DELTA1, x + ASYMPTOTE_CHECK_DELTA2
    const double ASYMPTOTE_CHECK_DELTA1 = xdiff * 1e-6;
    const double ASYMPTOTE_CHECK_DELTA2 = xdiff * 1e-5;
    const double ASYMPTOTE_CHECK_EPS    = ydiff * 1e-9;
    // Special eps for boundary of domain
    const double ASYMPTOTE_CHECK_BOUNDARY_EPS = ydiff * 1e-3;

    // For explicit functions
    // We will draw a function segment between every pair of adjacent
    // discontinuities (including 'edge of screen')
    // x-coordinate after a discontinuity to begin drawing function
    const float DISCONTINUITY_EPS = 1e-4f * xdiff;

    // Minimum x-distance between critical points
    const double MIN_DIST_BETWEEN_ROOTS  = 1e-7 * xdiff;

    env.vars[y_var] = std::numeric_limits<double>::quiet_NaN();
    // Discontinuity/root/extremum type enum
    enum {
        DISCONT_ASYMPT = 0, // asymptote (in middle of domain, e.g. 0 of 1/x)
        DISCONT_DOMAIN,     // domain boundary (possibly asymptote, e.g. 0 of ln(x))
        DISCONT_SCREEN,     // edge of screen
        ROOT,               // root
        EXTREMUM,           // extremum
        Y_INT,              // y-intercept
    };
    // CritPoint: discontinuity/root/extremum type
    // first: x-position second: enum
    using CritPoint = std::pair<double, int>;
    // Store discontinuities
    std::set<CritPoint> discont, roots_and_extrema;
    size_t idx = 0;
    // Push check helpers
    // Push to st if no other item less than MIN_DIST_BETWEEN_ROOTS from value
    auto push_if_valid = [&](double value, std::set<double>& st) {
        if (!std::isnan(value) && !std::isinf(value) &&
                value >= xmin && value <= xmax) {
            auto it = st.lower_bound(value);
            double cdist = 1.;
            if (it != st.end()) cdist = *it - value;
            if (it != st.begin()) {
                auto itp = it; --itp;
                cdist = std::min(cdist, value - *itp);
            }
            if (cdist >= MIN_DIST_BETWEEN_ROOTS) st.insert(value);
        }
    };
    // Push (value, type) to discont if no other distcontinuity's first item
    // is less than MIN_DIST_BETWEEN_ROOTS from value
    auto push_critpt_if_valid = [&](double value,
            CritPoint::second_type type,
            std::set<CritPoint>& st) {
        auto vc = CritPoint(value, type);
        if (!std::isnan(value) && !std::isinf(value) &&
                value >= xmin && value <= xmax) {
            auto it = st.lower_bound(vc);
            double cdist = 1.;
            if (it != st.end())
                cdist = it->first - value;
            if (it != st.begin()) {
                auto itp = it; --itp;
                cdist = std::min(cdist, value - itp->first);
            }
            if (cdist >= MIN_DIST_BETWEEN_ROOTS) {
                st.insert(vc);
            }
        }
    };

    // Stores points in current line, which will be drawn as a polyline
    std::vector<std::array<float, 2> > curr_line;
    // Draw a line and construct markers along the line
    // to allow clicking
    auto draw_line = [&](float psx, float psy, float sx, float sy) {
        if (reverse_xy) {
            std::swap(sx, sy);
            std::swap(psx, psy);
        }
        // Draw the line
        if (curr_line.empty() ||
                (psx > curr_line.back()[0] || psy != curr_line.back()[1])) {
            if (curr_line.size() > 1 &&
                    (func.type & Function::FUNC_TYPE_MOD_INEQ_STRICT) == 0) {
                buf_add_screen_polyline(draw_buf, view, curr_line, func.line_color, funcid, 2.);
            }
            curr_line.resize(2);
            curr_line[0] = {psx, psy};
            curr_line[1] = {sx, sy};
        } else {
            curr_line.push_back({sx, sy});
        }
        // Draw inequality region
        if (func.type & Function::FUNC_TYPE_MOD_INEQ) {
            if (func.type & Function::FUNC_TYPE_MOD_INEQ_LESS) {
                if (reverse_xy) {
                    buf_add_screen_rectangle(draw_buf, view,
                            0, psy, sx, sy - psy, true, ineq_color, 0.0f, funcid);
                } else {
                    buf_add_screen_rectangle(draw_buf, view,
                            psx, sy, sx - psx, view.shigh - sy, true, ineq_color,
                            0.0f, funcid);
                }
            } else {
                if (reverse_xy) {
                    buf_add_screen_rectangle(draw_buf, view,
                            psx, psy, view.swid - psx, sy - psy, true, ineq_color,
                            0.0f, funcid);
                } else {
                    buf_add_screen_rectangle(draw_buf, view,
                            psx, 0, sx - psx, sy, true, ineq_color, 0.0f,
                            funcid);
                }
            }
        }
    };
    // ** Find roots, asymptotes, extrema
    if (!func.diff.is_null() && funcs.size() <= max_functions_find_crit_points) {
        double prev_x, prev_y = 0.;
        for (int sx = 0; sx < swid; sx += 4) {
            const double x = reverse_xy ? _SY_TO_Y(sx) : _SX_TO_X(sx);
            env.vars[var] = x;
            double y = func.expr(env);
            const bool is_y_nan = std::isnan(y);

            if (!is_y_nan) {
                env.vars[var] = x;
                double dy = func.diff(env);
                if (!std::isnan(dy)) {
                    if (find_all_crit_pts) {
                        double root = func.expr.newton(NEWTON_ARGS, &func.diff, y, dy);
                        push_critpt_if_valid(root, ROOT, roots_and_extrema);
                    }
                    double asymp = func.recip.newton(NEWTON_ARGS,
                            &func.drecip, 1. / y, -dy / (y*y));
                    push_critpt_if_valid(asymp, DISCONT_ASYMPT, discont);

                    if (find_all_crit_pts) {
                        env.vars[var] = x;
                        double ddy = func.ddiff(env);
                        if (!std::isnan(ddy)) {
                            double extr = func.diff.newton(NEWTON_ARGS,
                                    &func.ddiff, dy, ddy);
                            push_critpt_if_valid(extr, EXTREMUM, roots_and_extrema);
                        }
                    }
                }
            }
            if (sx) {
                const bool is_prev_y_nan = std::isnan(prev_y);
                if (is_y_nan != is_prev_y_nan) {
                    // Search for cutoff via bisection
                    double lo = prev_x, hi = x;
                    while (hi - lo > DOMAIN_BISECTION_EPS) {
                        double mi = (lo + hi) * 0.5;
                        env.vars[var] = mi; double mi_y = func.expr(env);
                        if (std::isnan(mi_y) == is_prev_y_nan) {
                            lo = mi;
                        } else {
                            hi = mi;
                        }
                    }
                    double boundary_x_not_nan_side = is_prev_y_nan ? hi : lo;
                    push_critpt_if_valid(boundary_x_not_nan_side,
                            DISCONT_DOMAIN, discont);
                }
            }
            prev_x = x; prev_y = y;
        }
    }
    // Add screen edges to discontinuities list for convenience
    discont.emplace(xmin, DISCONT_SCREEN);
    discont.emplace(xmax, DISCONT_SCREEN);

    // Previous discontinuity infop
    double prev_discont_x = xmin;
    float prev_discont_sx;
    int prev_discont_type;
    size_t as_idx = 0;

    // ** Main explicit func drawing code: draw function from discont to discont
    for (const auto& discontinuity : discont) {
        float psx = -1.f, psy = -1.f;
        double discont_x = discontinuity.first;
        int discont_type = discontinuity.second;
        float discont_sx = reverse_xy ? _Y_TO_SY(discont_x) : _X_TO_SX(discont_x);

        if (as_idx > 0) {
            bool connector = prev_discont_type != DISCONT_SCREEN;
            double x_begin = prev_discont_x, x_end = discont_x;
            float sx_begin = prev_discont_sx, sx_end = discont_sx;
            if (reverse_xy) {
                std::swap(sx_begin, sx_end);
                std::swap(x_begin, x_end);
            }
            // Draw func between asymptotes
            for (float sxd = sx_begin + DISCONTINUITY_EPS; sxd < sx_end - DISCONTINUITY_EPS;) {
                const double x = reverse_xy ? _SY_TO_Y(sxd) : _SX_TO_X(sxd);
                env.vars[var] = x;
                double y = func.expr(env);

                if (!std::isnan(y)) {
                    if (y > ymax + ydiff) y = ymax + ydiff;
                    else if (y < ymin - ydiff) y = ymin - ydiff;
                    float sy = reverse_xy ?  _X_TO_SX(y) : _Y_TO_SY(y), sx = sxd;
                    if (connector) {
                        // Check if asymptote at previous position;
                        // if so then connect it
                        connector = false;
                        env.vars[var] = x_begin + ASYMPTOTE_CHECK_DELTA1;
                        double yp = func.expr(env);
                        env.vars[var] = x_begin + ASYMPTOTE_CHECK_DELTA2;
                        double yp2 = func.expr(env);
                        double eps = discont_type == DISCONT_ASYMPT ?
                            ASYMPTOTE_CHECK_EPS:
                            ASYMPTOTE_CHECK_BOUNDARY_EPS;
                        if (yp - yp2 > eps && sy > 0.f) {
                            psx = sx_begin;
                            psy = 0.f;
                        } else if (yp - yp2 < -eps && sy < (float)shigh) {
                            psx = sx_begin;
                            psy = static_cast<float>(shigh);
                        }
                    }
                    if (psx >= 0.0) draw_line(psx, psy, sx, sy);
                    psx = sx;
                    psy = sy;
                } else {
                    psx = -1;
                }
                if (discont.size() > 2 && discont.size() < 100) {
                    if ((as_idx > 1 && sxd - prev_discont_sx < 1.) ||
                            (as_idx < discont.size() - 1 && discont_sx - sxd < 1.)) {
                        sxd += 0.1f;
                    } else {
                        sxd += 0.2f;
                    }
                } else {
                    sxd += 0.2f;
                }
            }
            // Connect next asymptote
            if (discont_type != DISCONT_SCREEN) {
                env.vars[var] = x_end - ASYMPTOTE_CHECK_DELTA1;
                double yp = func.expr(env);
                env.vars[var] = x_end - ASYMPTOTE_CHECK_DELTA2;
                double yp2 = func.expr(env);
                float sx = -1, sy;
                double eps = discont_type == DISCONT_ASYMPT ?
                    ASYMPTOTE_CHECK_EPS:
                    ASYMPTOTE_CHECK_BOUNDARY_EPS;
                if (yp - yp2 > eps && psy > 0) {
                    sx = static_cast<float>(sx_end);
                    sy = 0.f;
                }
                if (yp - yp2 < -eps && psy < shigh) {
                    sx = sx_end;
                    sy = static_cast<float>(shigh);
                }
                if (psx >= 0.f && sx >= 0.f) {
                    draw_line(psx, psy, sx, sy);
                }
            }
        }
        ++as_idx;
        prev_discont_x = discont_x;
        prev_discont_type = discont_type;
        prev_discont_sx = discont_sx;
    }

    // Finish last line, if exists
    if (curr_line.size() > 1 && (func.type & Function::FUNC_TYPE_MOD_INEQ_STRICT) == 0) {
        buf_add_screen_polyline(draw_buf, view, curr_line, func.line_color, funcid, 2.);
    }
    if (funcs.size() <= max_functions_find_crit_points) {
        if (find_all_crit_pts) {
            std::vector<CritPoint> to_erase; // Save dubious points to delete from roots_and_extrama
            // Helper to draw roots/extrema/y-int and add a marker for it
            auto draw_extremum = [&](const CritPoint& cpt, double y) {
                env.vars[var] = cpt.first;
                double dy = func.diff(env);
                double ddy = func.ddiff(env);
                double x; int type;
                std::tie(x, type) = cpt;
                auto label =
                    type == Y_INT ? (reverse_xy ? PointMarker::LABEL_X_INT : PointMarker::LABEL_Y_INT) :
                    type == ROOT ? (reverse_xy ? PointMarker::LABEL_Y_INT : PointMarker::LABEL_X_INT) :
                    (type == EXTREMUM && ddy > 1e-100 * ydiff) ? PointMarker::LABEL_LOCAL_MIN :
                    (type == EXTREMUM && ddy < -1e-100 * ydiff) ? PointMarker::LABEL_LOCAL_MAX:
                    type == EXTREMUM ? PointMarker::LABEL_INFLECTION_PT:
                    PointMarker::LABEL_NONE;
                // Do not show
                if (label == PointMarker::LABEL_INFLECTION_PT ||
                        label == PointMarker::LABEL_NONE) {
                    to_erase.push_back(cpt);
                    return;
                }

                PointMarker ptm;
                ptm.label = label;
                ptm.y = y; ptm.x = x;
                if (reverse_xy) std::swap(ptm.x, ptm.y);
                if (type == Y_INT) label = PointMarker::LABEL_X_INT;
                else if (type == ROOT) label = PointMarker::LABEL_Y_INT;
                ptm.passive = false;
                ptm.rel_func = funcid;
                ptm.drag_var_x = ptm.drag_var_y = -1;
                pt_markers.push_back(std::move(ptm));
            };
            for (const CritPoint& cpt : roots_and_extrema) {
                env.vars[var] = cpt.first;
                double y = func.expr(env);
                draw_extremum(cpt, y);
            }
            // Delete the "dubious" points
            for (const CritPoint& x : to_erase) {
                roots_and_extrema.erase(x);
            }
            if (!func.expr.is_null() && !func.diff.is_null()) {
                env.vars[var] = 0;
                double y = func.expr(env);
                if (!std::isnan(y) && !std::isinf(y)) {
                    push_critpt_if_valid(0., Y_INT, roots_and_extrema); // y-int
                    auto cpt = CritPoint(0., Y_INT);
                    if (roots_and_extrema.count(cpt)) {
                        draw_extremum(cpt, y);
                    }
                }
            }
        }

        // Function intersection
        if (!func.diff.is_null() && funcs.size() <= max_functions_find_crit_points) {
            if (find_all_crit_pts) {
                for (size_t funcid2 = 0; funcid2 < (funcs.size() <= max_functions_find_all_crit_points
                                                    ? funcid : funcs.size()); ++funcid2) {
                    auto& func2 = funcs[funcid2];
                    if (func2.diff.is_null()) continue;
                    int ft_nomod = func.type & ~Function::FUNC_TYPE_MOD_ALL;
                    int f2t_nomod = func2.type & ~Function::FUNC_TYPE_MOD_ALL;
                    if (ft_nomod == f2t_nomod) {
                        // Same direction, use Newton on difference.
                        Expr sub_expr = func.expr - func2.expr;
                        Expr diff_sub_expr = func.diff - func2.diff;
                        // diff_sub_expr.optimize();
                        if (diff_sub_expr.is_null()) continue;
                        std::set<double> st;
                        for (int sxd = 0; sxd < swid; sxd += 10) {
                            const double x = reverse_xy ? _SY_TO_Y(sxd) : _SX_TO_X(sxd);
                            double root = sub_expr.newton(NEWTON_ARGS, &diff_sub_expr);
                            push_if_valid(root, st);
                        }
                        for (double x : st) {
                            env.vars[var] = x;
                            double y = func.expr(env);
                            size_t idx = pt_markers.size();
                            PointMarker ptm;
                            ptm.label = PointMarker::LABEL_INTERSECTION;
                            ptm.x = x; ptm.y = y;
                            if (reverse_xy) std::swap(ptm.x, ptm.y);
                            ptm.passive = false;
                            ptm.rel_func = -1;
                            ptm.drag_var_x = ptm.drag_var_y = -1;
                            pt_markers.push_back(std::move(ptm));
                        } // for x : st
                    } else if (ft_nomod + f2t_nomod == 8) {
                        // Inverse direction, use Newton on composition.
                        Expr comp_expr = func2.expr;
                        auto other_var = var == x_var ? y_var  : x_var;
                        comp_expr.sub_var(other_var, func.expr);
                        comp_expr = comp_expr - Expr::AST{Expr::ASTNode::varref(var)};
                        comp_expr.optimize();

                        Expr diff_comp_expr = func2.diff;
                        diff_comp_expr.sub_var(other_var, func.expr);
                        diff_comp_expr = diff_comp_expr * func.diff - Expr::constant(1.);
                        diff_comp_expr.optimize();
                        if (diff_comp_expr.is_null()) continue;
                        std::set<double> st;
                        for (int sxd = 0; sxd < swid; sxd += 2) {
                            const double x = reverse_xy ? _SY_TO_Y(sxd) : _SX_TO_X(sxd);
                            double root = comp_expr.newton(
                                    var, x, env, EPS_STEP * 10.f, EPS_ABS * 10.f, MAX_ITER,
                                    xmin - NEWTON_SIDE_ALLOW, xmax + NEWTON_SIDE_ALLOW,
                                    &diff_comp_expr);
                            push_if_valid(root, st);
                        }
                        for (double x : st) {
                            env.vars[var] = x;
                            double y = func.expr(env);
                            size_t idx = pt_markers.size();
                            PointMarker ptm;
                            ptm.label = PointMarker::LABEL_INTERSECTION;
                            ptm.x = x; ptm.y = y;
                            if (reverse_xy) std::swap(ptm.x, ptm.y);
                            ptm.passive = false;
                            ptm.rel_func = -1;
                            ptm.drag_var_x = ptm.drag_var_y = -1;
                            pt_markers.push_back(std::move(ptm));
                        } // for x : st
                    } // if
                    // o.w. not supported.
                } // for funcid2
            } // if (find_all_intersections || funcid == curr_func)
        } // if (!func.diff.is_null())
    } // if (funcs.size() <= max_functions_find_crit_points)
    // * End of function intersection code
}